

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
MiniScript::ListStorage<MiniScript::TACLine>::ListStorage
          (ListStorage<MiniScript::TACLine> *this,long slots)

{
  undefined1 auVar1 [16];
  TACLine *pTVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  
  (this->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__RefCountedStorage_001bf670;
  (this->super_RefCountedStorage).refCount = 1;
  (this->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 0;
  (this->super_SimpleVector<MiniScript::TACLine>).mQtyItems = 0;
  (this->super_SimpleVector<MiniScript::TACLine>).mBufItems = slots;
  pTVar2 = (TACLine *)0x0;
  if (slots != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = slots;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x60),8) == 0) {
      uVar5 = SUB168(auVar1 * ZEXT816(0x60),0) | 8;
    }
    plVar3 = (long *)operator_new__(uVar5);
    *plVar3 = slots;
    pTVar2 = (TACLine *)(plVar3 + 1);
    lVar4 = 0;
    do {
      *(undefined2 *)(&(pTVar2->lhs).type + lVar4) = 0;
      *(undefined1 *)((long)plVar3 + lVar4 + 10) = 0;
      *(undefined4 *)((long)plVar3 + lVar4 + 0x18) = 0;
      *(undefined2 *)((long)plVar3 + lVar4 + 0x20) = 0;
      *(undefined1 *)((long)plVar3 + lVar4 + 0x22) = 0;
      *(undefined2 *)((long)plVar3 + lVar4 + 0x30) = 0;
      *(undefined1 *)((long)plVar3 + lVar4 + 0x32) = 0;
      *(undefined8 *)((long)plVar3 + lVar4 + 0x40) = 0;
      *(undefined1 *)((long)plVar3 + lVar4 + 0x48) = 0;
      *(undefined8 *)((long)plVar3 + lVar4 + 0x50) = 0;
      *(undefined1 *)((long)plVar3 + lVar4 + 0x58) = 0;
      *(undefined4 *)((long)plVar3 + lVar4 + 0x60) = 0;
      lVar4 = lVar4 + 0x60;
    } while (slots * 0x60 != lVar4);
  }
  (this->super_SimpleVector<MiniScript::TACLine>).mBuf = pTVar2;
  (this->super_RefCountedStorage)._vptr_RefCountedStorage = (_func_int **)&PTR__ListStorage_001bf400
  ;
  return;
}

Assistant:

ListStorage(long slots) : SimpleVector<T>(slots) {}